

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O3

void anon_unknown.dwarf_438e::gcd_1_thread(void)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Monitor perfmon_scope_monitor_0;
  Monitor perfmon_scope_monitor_1;
  Monitor local_50;
  Monitor local_40;
  
  if (((anonymous_namespace)::gcd_1_thread()::$_0::operator()()::perfmon_internal_index_result ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::gcd_1_thread()::$_0::operator()()::
                                   perfmon_internal_index_result), iVar4 != 0)) {
    (anonymous_namespace)::gcd_1_thread()::$_0::operator()()::perfmon_internal_index_result =
         perfmon::internal::GetCounterIndex("gcd_1_thread");
    __cxa_guard_release(&(anonymous_namespace)::gcd_1_thread()::$_0::operator()()::
                         perfmon_internal_index_result);
  }
  local_50.counter_index_ =
       (anonymous_namespace)::gcd_1_thread()::$_0::operator()()::perfmon_internal_index_result;
  local_50.start_tick_ = rdtsc();
  iVar4 = 0;
  if (0 < N) {
    uVar7 = 0;
    iVar1 = N;
    do {
      if (0 < iVar1) {
        uVar2 = 0;
        do {
          if (((anonymous_namespace)::gcd_1_thread()::$_1::operator()()::
               perfmon_internal_index_result == '\0') &&
             (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::gcd_1_thread()::$_1::operator()()
                                           ::perfmon_internal_index_result), iVar1 != 0)) {
            (anonymous_namespace)::gcd_1_thread()::$_1::operator()()::perfmon_internal_index_result
                 = perfmon::internal::GetCounterIndex("congestion_point");
            __cxa_guard_release(&(anonymous_namespace)::gcd_1_thread()::$_1::operator()()::
                                 perfmon_internal_index_result);
          }
          local_40.counter_index_ =
               (anonymous_namespace)::gcd_1_thread()::$_1::operator()()::
               perfmon_internal_index_result;
          local_40.start_tick_ = rdtsc();
          iVar8 = (int)uVar2;
          iVar1 = iVar8;
          if (uVar7 != 0) {
            uVar6 = (ulong)uVar7;
            do {
              iVar5 = (int)uVar6;
              uVar6 = (long)(int)uVar2 % (long)iVar5;
              uVar2 = uVar6 & 0xffffffff;
              iVar3 = (int)uVar6;
              iVar1 = iVar5;
              if (iVar3 == 0) break;
              uVar6 = (long)iVar5 % (long)iVar3 & 0xffffffff;
              iVar1 = iVar3;
            } while ((int)((long)iVar5 % (long)iVar3) != 0);
          }
          iVar4 = iVar4 + iVar1;
          perfmon::internal::Monitor::~Monitor(&local_40);
          uVar9 = iVar8 + 1;
          uVar2 = (ulong)uVar9;
          iVar1 = N;
        } while ((int)uVar9 < N);
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < iVar1);
  }
  LOCK();
  (anonymous_namespace)::global_gcd_1_result = (anonymous_namespace)::global_gcd_1_result + iVar4;
  UNLOCK();
  perfmon::internal::Monitor::~Monitor(&local_50);
  return;
}

Assistant:

void gcd_1_thread() {
  PERFMON_SCOPE("gcd_1_thread");
  int result = 0;
  for (int i = 0; i < N; ++i) {
    for (int j = 0; j < N; ++j) {
      PERFMON_SCOPE("congestion_point");
      result += gcd(i, j);
    }
  }
  global_gcd_1_result += result;
}